

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

string_view __thiscall
bloaty::anon_unknown_0::ElfFile::GetRegion(ElfFile *this,uint64_t start,uint64_t n)

{
  ulong uVar1;
  string_view sVar2;
  
  if (CARRY8(n,start)) {
    Throw("integer overflow in addition",0x4b);
  }
  uVar1 = (this->data_)._M_len;
  if (n + start <= uVar1) {
    if (start <= uVar1) {
      if (uVar1 - start < n) {
        n = uVar1 - start;
      }
      sVar2._M_str = (this->data_)._M_str + start;
      sVar2._M_len = n;
      return sVar2;
    }
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  Throw("region out-of-bounds",0x5d);
}

Assistant:

string_view GetRegion(uint64_t start, uint64_t n) const {
    return StrictSubstr(data_, start, n);
  }